

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O2

void __thiscall CTB<UFPC>::FirstScan(CTB<UFPC> *this)

{
  Mat1i *pMVar1;
  Mat1b *pMVar2;
  long lVar3;
  undefined4 uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar1->field_0x10,0,*(long *)&pMVar1->field_0x20 - *(long *)&pMVar1->field_0x18
        );
  uVar11 = 0;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar12 = *(uint *)&pMVar2->field_0xc;
  lVar6 = (long)(int)uVar12;
  lVar14 = (long)*(int *)&pMVar2->field_0x8;
  uVar15 = 0;
  if (0 < (int)uVar12) {
    uVar15 = (ulong)uVar12;
  }
  lVar13 = -1;
  lVar21 = 1;
  do {
    if (lVar14 <= (long)uVar11) {
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar19 = *(long *)&pMVar2->field_0x10;
    lVar10 = **(long **)&pMVar2->field_0x48;
    lVar8 = *(long *)&pMVar1->field_0x10;
    lVar3 = **(long **)&pMVar1->field_0x48;
    lVar9 = lVar3 * uVar11 + lVar8;
    uVar22 = uVar11 | 1;
    lVar16 = lVar3 * lVar13 + lVar8;
    lVar17 = lVar10 * lVar13 + lVar19;
    lVar8 = lVar3 * lVar21 + lVar8;
    lVar7 = lVar10 * lVar21 + lVar19;
    lVar19 = lVar10 * uVar11 + lVar19;
    lVar10 = -4;
    lVar23 = 0;
    uVar4 = 0xffffffff;
    iVar20 = -1;
    for (lVar18 = 1; lVar18 - uVar15 != 1; lVar18 = lVar18 + 1) {
      switch(uVar4) {
      case 1:
        if (*(char *)(lVar19 + -1 + lVar18) != '\0') {
          if (uVar11 == 0) {
LAB_0019d7e0:
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar12 = UFPC::length_ + 1;
            *(uint *)(lVar9 + -4 + lVar18 * 4) = UFPC::length_;
            UFPC::length_ = uVar12;
LAB_0019d805:
            iVar20 = 6;
          }
          else if (*(char *)(lVar17 + -1 + lVar18) == '\0') {
            if ((lVar6 <= lVar18) || (*(char *)(lVar17 + lVar18) == '\0')) {
              if ((lVar18 == 1) || (*(char *)(lVar17 + -2 + lVar18) == '\0')) goto LAB_0019d7e0;
              *(undefined4 *)(lVar9 + -4 + lVar18 * 4) = *(undefined4 *)(lVar16 + -8 + lVar18 * 4);
              goto LAB_0019d805;
            }
            uVar12 = *(uint *)(lVar16 + lVar18 * 4);
            *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
            iVar20 = 5;
            if ((lVar18 != 1) && (*(char *)(lVar17 + -2 + lVar18) != '\0')) {
              UFPC::Merge(uVar12,*(uint *)(lVar16 + -8 + lVar18 * 4));
              iVar20 = 5;
            }
          }
          else {
            *(undefined4 *)(lVar9 + -4 + lVar18 * 4) = *(undefined4 *)(lVar16 + -4 + lVar18 * 4);
            iVar20 = 4;
          }
          if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
            *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -4 + lVar18 * 4);
          }
          goto LAB_0019d829;
        }
        if ((lVar14 <= (long)uVar22) || (*(char *)(lVar7 + -1 + lVar18) == '\0')) goto LAB_0019d4ed;
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar12 = UFPC::length_ + 1;
        *(uint *)(lVar8 + -4 + lVar18 * 4) = UFPC::length_;
        UFPC::length_ = uVar12;
        uVar4 = 3;
        break;
      case 2:
        if (*(char *)(lVar19 + -1 + lVar18) != '\0') {
          if (iVar20 == 6) {
            uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
            *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
            iVar20 = 6;
            uVar4 = 2;
            if (uVar11 != 0) {
              iVar20 = 6;
              uVar4 = 2;
              if (lVar18 < lVar6) {
                iVar20 = 6;
                uVar4 = 2;
                if (*(char *)(lVar17 + lVar18) != '\0') {
                  UFPC::Merge(uVar12,*(uint *)(lVar16 + lVar18 * 4));
                  uVar4 = 2;
                  goto LAB_0019d6cd;
                }
              }
            }
          }
          else {
            if (iVar20 != 5) {
              uVar4 = 2;
              goto LAB_0019d29d;
            }
LAB_0019d2ec:
            *(undefined4 *)(lVar9 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -8 + lVar18 * 4);
            uVar4 = 5;
            iVar20 = 5;
          }
          goto LAB_0019d2fc;
        }
LAB_0019d32f:
        if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
          *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -8 + lVar18 * 4);
          goto LAB_0019d358;
        }
LAB_0019d4ed:
        uVar4 = 1;
        break;
      case 3:
      case 7:
      case 9:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') {
          if ((lVar14 <= (long)uVar22) || (*(char *)(lVar7 + -1 + lVar18) == '\0'))
          goto LAB_0019d4ed;
          *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar8 + -8 + lVar18 * 4);
          uVar4 = 9;
        }
        else {
          if (uVar11 == 0) {
LAB_0019d3d8:
            uVar12 = *(uint *)(lVar8 + -8 + lVar18 * 4);
            *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
            iVar20 = 6;
            if ((lVar18 != 1 && uVar11 != 0) &&
               (iVar20 = 6, *(char *)(lVar17 + -2 + lVar18) != '\0')) {
              puVar5 = (uint *)((lVar9 - lVar3) + (lVar23 + -1) * 4);
              iVar20 = 6;
LAB_0019d41b:
              UFPC::Merge(uVar12,*puVar5);
            }
          }
          else {
            if (*(char *)(lVar17 + -1 + lVar18) != '\0') {
              uVar12 = *(uint *)(lVar16 + -4 + lVar18 * 4);
              *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
              puVar5 = (uint *)(lVar3 + lVar9 + -4 + lVar23 * 4);
              iVar20 = 4;
              goto LAB_0019d41b;
            }
            if ((lVar6 <= lVar18) || (*(char *)(lVar17 + lVar18) == '\0')) goto LAB_0019d3d8;
            uVar12 = *(uint *)(lVar16 + lVar18 * 4);
            *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
            UFPC::Merge(uVar12,*(uint *)(lVar8 + -8 + lVar18 * 4));
            iVar20 = 5;
            if ((lVar18 != 1) && (*(char *)(lVar17 + -2 + lVar18) != '\0')) {
              uVar12 = *(uint *)(lVar9 + -4 + lVar18 * 4);
              puVar5 = (uint *)(lVar16 + lVar10);
              goto LAB_0019d41b;
            }
          }
          if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
            *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -4 + lVar18 * 4);
          }
          uVar4 = 8;
        }
        break;
      case 4:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') goto LAB_0019d32f;
        if (iVar20 == 6) {
          uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
          *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
          iVar20 = 6;
          uVar4 = 4;
          if (uVar11 == 0) goto LAB_0019d2fc;
LAB_0019d5fe:
          iVar20 = 6;
          uVar4 = 4;
          if (lVar18 < lVar6) {
            iVar20 = 6;
            uVar4 = 4;
            if (*(char *)(lVar17 + lVar18) != '\0') {
              UFPC::Merge(uVar12,*(uint *)(lVar16 + lVar18 * 4));
              uVar4 = 4;
LAB_0019d6cd:
              iVar20 = 5;
            }
          }
        }
        else {
          if (iVar20 == 5) goto LAB_0019d2ec;
          uVar4 = 4;
LAB_0019d29d:
          if (iVar20 == 4) {
            uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
            *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
            iVar20 = 6;
            uVar4 = 4;
            if (uVar11 != 0) {
              uVar4 = 4;
              iVar20 = 4;
              if (*(char *)(lVar17 + -1 + lVar18) == '\0') goto LAB_0019d5fe;
            }
          }
        }
        goto LAB_0019d2fc;
      case 5:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') goto LAB_0019d32f;
        uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
        *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
        iVar20 = 6;
        if ((((uVar11 != 0) && (iVar20 = 4, *(char *)(lVar17 + -1 + lVar18) == '\0')) &&
            (iVar20 = 6, lVar18 < lVar6)) && (iVar20 = 6, *(char *)(lVar17 + lVar18) != '\0')) {
          UFPC::Merge(uVar12,*(uint *)(lVar16 + lVar18 * 4));
          iVar20 = 5;
        }
        if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
          *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -4 + lVar18 * 4);
        }
        uVar4 = 4;
        break;
      case 6:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') goto LAB_0019d32f;
        if (iVar20 == 6) {
          uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
          *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
          iVar20 = 6;
          uVar4 = 6;
          if (uVar11 != 0) {
            iVar20 = 6;
            uVar4 = 6;
            if (lVar18 < lVar6) {
              iVar20 = 6;
              uVar4 = 6;
              if (*(char *)(lVar17 + lVar18) != '\0') {
                UFPC::Merge(uVar12,*(uint *)(lVar16 + lVar18 * 4));
                iVar20 = 5;
                uVar4 = 6;
              }
            }
          }
        }
        else {
          uVar4 = 6;
          if (iVar20 == 5) goto LAB_0019d2ec;
        }
        goto LAB_0019d2fc;
      case 8:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') goto LAB_0019d32f;
        if (iVar20 != 6) {
          if (iVar20 == 5) goto LAB_0019d2ec;
          uVar4 = 8;
          goto LAB_0019d29d;
        }
        uVar12 = *(uint *)(lVar9 + -8 + lVar18 * 4);
        *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
        iVar20 = 6;
        uVar4 = 8;
        if (uVar11 != 0) {
          iVar20 = 6;
          uVar4 = 8;
          if (lVar18 < lVar6) {
            iVar20 = 6;
            uVar4 = 8;
            if (*(char *)(lVar17 + lVar18) != '\0') {
              UFPC::Merge(uVar12,*(uint *)(lVar16 + lVar18 * 4));
              uVar4 = 8;
              goto LAB_0019d6cd;
            }
          }
        }
LAB_0019d2fc:
        if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
          *(undefined4 *)(lVar8 + -4 + lVar18 * 4) = *(undefined4 *)(lVar9 + -4 + lVar18 * 4);
        }
        break;
      case 0xffffffff:
        if (*(char *)(lVar19 + -1 + lVar18) == '\0') {
          if ((lVar14 <= (long)uVar22) || (*(char *)(lVar7 + -1 + lVar18) == '\0'))
          goto LAB_0019d4ed;
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar12 = UFPC::length_ + 1;
          *(uint *)(lVar8 + -4 + lVar18 * 4) = UFPC::length_;
          UFPC::length_ = uVar12;
LAB_0019d358:
          uVar4 = 7;
        }
        else {
          if (uVar11 == 0) {
LAB_0019d6f6:
            UFPC::P_[UFPC::length_] = UFPC::length_;
            iVar20 = 6;
            uVar12 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else if (*(char *)(lVar17 + -1 + lVar18) == '\0') {
            if ((lVar6 <= lVar18) || (*(char *)(lVar17 + lVar18) == '\0')) goto LAB_0019d6f6;
            uVar12 = *(uint *)(lVar16 + lVar18 * 4);
            iVar20 = 5;
          }
          else {
            uVar12 = *(uint *)(lVar16 + -4 + lVar18 * 4);
            iVar20 = 4;
          }
          *(uint *)(lVar9 + -4 + lVar18 * 4) = uVar12;
          if (((long)uVar22 < lVar14) && (*(char *)(lVar7 + -1 + lVar18) != '\0')) {
            *(uint *)(lVar8 + -4 + lVar18 * 4) = uVar12;
          }
LAB_0019d829:
          uVar4 = 2;
        }
      }
      lVar23 = lVar23 + 1;
      lVar10 = lVar10 + 4;
    }
    uVar11 = uVar11 + 2;
    lVar13 = lVar13 + 2;
    lVar21 = lVar21 + 2;
  } while( true );
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }